

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

int dumb_it_trim_silent_patterns(DUH *duh)

{
  uint uVar1;
  uint order;
  int iVar2;
  int iVar3;
  DUMB_IT_SIGDATA *pDVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  IT_PATTERN *pIVar8;
  
  iVar3 = -1;
  if ((((duh != (DUH *)0x0) && (pDVar4 = duh_get_it_sigdata(duh), pDVar4 != (DUMB_IT_SIGDATA *)0x0))
      && (pDVar4->order != (uchar *)0x0)) && (pDVar4->pattern != (IT_PATTERN *)0x0)) {
    lVar7 = 0;
    while( true ) {
      uVar1 = pDVar4->n_orders;
      if ((int)uVar1 <= lVar7) break;
      if ((int)(uint)pDVar4->order[lVar7] < pDVar4->n_patterns) {
        pIVar8 = pDVar4->pattern + pDVar4->order[lVar7];
        iVar2 = is_pattern_silent(pIVar8,(uint)lVar7);
        if (iVar2 < 2) break;
        pIVar8->n_rows = 1;
        pIVar8->n_entries = 0;
        if (pIVar8->entry != (IT_ENTRY *)0x0) {
          free(pIVar8->entry);
          pIVar8->entry = (IT_ENTRY *)0x0;
        }
      }
      lVar7 = lVar7 + 1;
    }
    if ((uint)lVar7 != uVar1) {
      order = uVar1;
      while (uVar6 = order, uVar5 = (int)uVar1 >> 0x1f & uVar1, 0 < (int)uVar6) {
        order = uVar6 - 1;
        if ((int)(uint)pDVar4->order[order] < pDVar4->n_patterns) {
          pIVar8 = pDVar4->pattern + pDVar4->order[order];
          iVar3 = is_pattern_silent(pIVar8,order);
          uVar5 = uVar6;
          if (iVar3 < 2) break;
          pIVar8->n_rows = 1;
          pIVar8->n_entries = 0;
          if (pIVar8->entry != (IT_ENTRY *)0x0) {
            free(pIVar8->entry);
            pIVar8->entry = (IT_ENTRY *)0x0;
          }
        }
      }
      iVar3 = -(uint)((int)uVar5 < 1);
    }
  }
  return iVar3;
}

Assistant:

int DUMBEXPORT dumb_it_trim_silent_patterns(DUH * duh) {
	int n;
	DUMB_IT_SIGDATA *sigdata;

	if (!duh) return -1;

	sigdata = duh_get_it_sigdata(duh);

	if (!sigdata || !sigdata->order || !sigdata->pattern) return -1;

	for (n = 0; n < sigdata->n_orders; n++) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n == sigdata->n_orders) return -1;

	for (n = sigdata->n_orders - 1; n >= 0; n--) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n < 0) return -1;

	/*duh->length = dumb_it_build_checkpoints(sigdata, 0);*/

	return 0;
}